

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

monitor * monitor_list_get_workspace_monitor(monitor_list *monitor_list,workspace *workspace)

{
  monitor *pmVar1;
  monitor *monitor;
  node *monitor_item;
  workspace *workspace_local;
  monitor_list *monitor_list_local;
  
  if (workspace != (workspace *)0x0) {
    for (monitor = (monitor *)monitor_list->monitors->head; monitor != (monitor *)0x0;
        monitor = *(monitor **)monitor) {
      pmVar1 = *(monitor **)&(monitor->offsets).bottom;
      if ((pmVar1->workspace != (workspace *)0x0) && (pmVar1->workspace->index == workspace->index))
      {
        return pmVar1;
      }
    }
  }
  return (monitor *)0x0;
}

Assistant:

struct monitor *monitor_list_get_workspace_monitor(const struct monitor_list *monitor_list,
                                                   const struct workspace *workspace)
{
        if (workspace == NULL) {
                return NULL;
        }

        LIST_FOR_EACH(monitor_list->monitors, monitor_item)
        {
                struct monitor *monitor = (struct monitor *)monitor_item->data;

                if (monitor->workspace == NULL) {
                        continue;
                }

                if (monitor->workspace->index == workspace->index) {
                        return monitor;
                }
        }

        return NULL;
}